

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint ucvector_reserve(ucvector *p,size_t size)

{
  void *ptr;
  void *pvVar1;
  ulong in_RSI;
  undefined8 *in_RDI;
  void *data;
  size_t newsize;
  size_t in_stack_ffffffffffffffd8;
  
  if ((ulong)in_RDI[2] < in_RSI) {
    ptr = (void *)(in_RSI + ((ulong)in_RDI[2] >> 1));
    pvVar1 = lodepng_realloc(ptr,in_stack_ffffffffffffffd8);
    if (pvVar1 == (void *)0x0) {
      return 0;
    }
    in_RDI[2] = ptr;
    *in_RDI = pvVar1;
  }
  return 1;
}

Assistant:

static unsigned ucvector_reserve(ucvector* p, size_t size) {
  if(size > p->allocsize) {
    size_t newsize = size + (p->allocsize >> 1u);
    void* data = lodepng_realloc(p->data, newsize);
    if(data) {
      p->allocsize = newsize;
      p->data = (unsigned char*)data;
    }
    else return 0; /*error: not enough memory*/
  }
  return 1; /*success*/
}